

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QString,QList<QString>>::emplaceValue<QList<QString>const&>
          (Node<QString,QList<QString>> *this,QList<QString> *args)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (args->d).d;
  local_28.ptr = (args->d).ptr;
  local_28.size = (args->d).size;
  if (local_28.d != (Data *)0x0) {
    LOCK();
    ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)(this + 0x18),&local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }